

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

char * spvtools::opt::anon_unknown_19::ParseNumberUntilSeparator(char *str,uint32_t *number)

{
  bool bVar1;
  char *text;
  allocator local_51;
  string local_50 [8];
  string number_in_str;
  char *number_end;
  char *number_begin;
  uint32_t *number_local;
  char *str_local;
  
  number_local = (uint32_t *)str;
  while( true ) {
    bVar1 = IsSeparator((char)*number_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    number_local = (uint32_t *)((long)number_local + 1);
  }
  number_in_str.field_2._8_8_ = number_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,str,(long)number_local - (long)str,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  text = (char *)std::__cxx11::string::c_str();
  bVar1 = utils::ParseNumber<unsigned_int>(text,number);
  if (bVar1) {
    str_local = (char *)number_local;
  }
  else {
    str_local = (char *)0x0;
  }
  std::__cxx11::string::~string(local_50);
  return str_local;
}

Assistant:

const char* ParseNumberUntilSeparator(const char* str, uint32_t* number) {
  const char* number_begin = str;
  while (!IsSeparator(*str)) str++;
  const char* number_end = str;
  std::string number_in_str(number_begin, number_end - number_begin);
  if (!utils::ParseNumber(number_in_str.c_str(), number)) {
    // The descriptor set is not a valid uint32 number.
    return nullptr;
  }
  return str;
}